

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::Clear
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  ulong uVar1;
  BayesianProbitRegressor_Gaussian *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->featureweight_, this_00 != (BayesianProbitRegressor_Gaussian *)0x0)) {
    BayesianProbitRegressor_Gaussian::~BayesianProbitRegressor_Gaussian(this_00);
    operator_delete(this_00,0x28);
  }
  this->featureweight_ = (BayesianProbitRegressor_Gaussian *)0x0;
  this->featurevalue_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureValueWeight::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor.FeatureValueWeight)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  if (GetArenaForAllocation() == nullptr && featureweight_ != nullptr) {
    delete featureweight_;
  }
  featureweight_ = nullptr;
  featurevalue_ = 0u;
  _internal_metadata_.Clear<std::string>();
}